

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkDropSatOutputs(Abc_Ntk_t *pNtk,Vec_Ptr_t *vCexes,int fVerbose)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  uint uVar4;
  
  if (vCexes->nSize != pNtk->vPos->nSize) {
    __assert_fail("Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x705,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  pAVar1 = Abc_AigConst1(pNtk);
  pVVar2 = pNtk->vPos;
  if (pVVar2->nSize < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      if (vCexes->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (vCexes->pArray[lVar3] != (void *)0x0) {
        pObj = (Abc_Obj_t *)pVVar2->pArray[lVar3];
        Abc_ObjPatchFanin(pObj,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^ (ulong)pAVar1 ^ 1));
        if (((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
            (ulong)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]) != ((ulong)pAVar1 ^ 1)) {
          __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                        ,0x70e,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
        }
        uVar4 = uVar4 + 1;
        pVVar2 = pNtk->vPos;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar2->nSize);
  }
  if (fVerbose != 0) {
    printf("Logic cones of %d POs have been replaced by constant 0.\n",(ulong)uVar4);
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  return;
}

Assistant:

void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    int i, Counter = 0;
    assert( Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk) );
    pConst0 = Abc_ObjNot( Abc_AigConst1(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( Vec_PtrEntry( vCexes, i ) == NULL )
            continue;
        Counter++;
        pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
        assert( Abc_ObjChild0(pObj) == pConst0 );
        // if a PO is driven by a latch, they have the same name...
//        if ( Abc_ObjIsBo(pObj) )
//            Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj) );
    }
    if ( fVerbose )
        printf( "Logic cones of %d POs have been replaced by constant 0.\n", Counter );
    Counter = Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
//    printf( "Cleanup removed %d nodes.\n", Counter );
}